

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_setpoint.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionPosition_setpoint::ChFunctionPosition_setpoint
          (ChFunctionPosition_setpoint *this,ChFunctionPosition_setpoint *other)

{
  long lVar1;
  undefined1 auVar2 [32];
  
  (this->super_ChFunctionPosition)._vptr_ChFunctionPosition =
       (_func_int **)&PTR__ChFunctionPosition_setpoint_00b468f0;
  (this->P).m_data[0] = 0.0;
  (this->P).m_data[1] = 0.0;
  (this->P).m_data[2] = 0.0;
  (this->P_ds).m_data[0] = 0.0;
  (this->P_ds).m_data[1] = 0.0;
  (this->P_ds).m_data[2] = 0.0;
  (this->P_dsds).m_data[0] = 0.0;
  (this->P_dsds).m_data[1] = 0.0;
  (this->P_dsds).m_data[2] = 0.0;
  auVar2 = ZEXT432(0) << 0x40;
  this->last_P = (ChVector<double>)auVar2._0_24_;
  (this->last_P_ds).m_data[0] = (double)auVar2._24_8_;
  *(undefined1 (*) [32])((this->last_P).m_data + 2) = auVar2;
  this->mode = other->mode;
  this->S = other->S;
  if (other == this) {
    lVar1 = 0x60;
  }
  else {
    lVar1 = 0x90;
    (this->P).m_data[0] = (other->P).m_data[0];
    (this->P).m_data[1] = (other->P).m_data[1];
    (this->P).m_data[2] = (other->P).m_data[2];
    (this->P_ds).m_data[0] = (other->P_ds).m_data[0];
    (this->P_ds).m_data[1] = (other->P_ds).m_data[1];
    (this->P_ds).m_data[2] = (other->P_ds).m_data[2];
    (this->P_dsds).m_data[0] = (other->P_dsds).m_data[0];
    (this->P_dsds).m_data[1] = (other->P_dsds).m_data[1];
    (this->P_dsds).m_data[2] = (other->P_dsds).m_data[2];
    this->last_s = other->last_s;
    (this->last_P).m_data[0] = (other->last_P).m_data[0];
    (this->last_P).m_data[1] = (other->last_P).m_data[1];
    (this->last_P).m_data[2] = (other->last_P).m_data[2];
    (this->last_P_ds).m_data[0] = (other->last_P_ds).m_data[0];
    (this->last_P_ds).m_data[1] = (other->last_P_ds).m_data[1];
  }
  *(undefined8 *)
   ((long)&(((ChFunctionPosition_setpoint *)(&this->P + -1))->super_ChFunctionPosition).
           _vptr_ChFunctionPosition + lVar1) =
       *(undefined8 *)
        ((long)&(((ChFunctionPosition_setpoint *)(&other->P + -1))->super_ChFunctionPosition).
                _vptr_ChFunctionPosition + lVar1);
  return;
}

Assistant:

ChFunctionPosition_setpoint::ChFunctionPosition_setpoint(const ChFunctionPosition_setpoint& other) {
    mode = other.mode;
    S = other.S;
    P = other.P;
    P_ds = other.P_ds;
    P_dsds = other.P_dsds;
    last_s = other.last_s;
    last_P = other.last_P;
    last_P_ds = other.last_P_ds;
}